

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O2

WebPIDecoder * NewDecoder(WebPDecBuffer *output_buffer,WebPBitstreamFeatures *features)

{
  WebPDecBuffer *buffer;
  int iVar1;
  WebPIDecoder *ptr;
  
  ptr = (WebPIDecoder *)WebPSafeCalloc(1,0x1f0);
  if (ptr != (WebPIDecoder *)0x0) {
    ptr->state = STATE_WEBP_HEADER;
    ptr->chunk_size = 0;
    ptr->last_mb_y = -1;
    (ptr->mem).mode = MEM_MODE_NONE;
    (ptr->mem).buf_size = 0;
    (ptr->mem).buf = (uint8_t *)0x0;
    (ptr->mem).part0_size = 0;
    (ptr->mem).part0_buf = (uint8_t *)0x0;
    buffer = &ptr->output;
    iVar1 = WebPInitDecBufferInternal(buffer,0x210);
    if (iVar1 != 0) {
      iVar1 = VP8InitIoInternal(&ptr->io,0x210);
      if (iVar1 != 0) {
        WebPResetDecParams(&ptr->params);
        if (output_buffer == (WebPDecBuffer *)0x0) {
          (ptr->params).output = buffer;
        }
        else {
          iVar1 = WebPAvoidSlowMemory(output_buffer,features);
          if (iVar1 != 0) {
            (ptr->params).output = buffer;
            ptr->final_output = output_buffer;
            (ptr->output).colorspace = output_buffer->colorspace;
            goto LAB_00107a23;
          }
          (ptr->params).output = output_buffer;
        }
        ptr->final_output = (WebPDecBuffer *)0x0;
LAB_00107a23:
        WebPInitCustomIo(&ptr->params,&ptr->io);
        return ptr;
      }
    }
    WebPSafeFree(ptr);
  }
  return (WebPIDecoder *)0x0;
}

Assistant:

WEBP_NODISCARD static WebPIDecoder* NewDecoder(
    WebPDecBuffer* const output_buffer,
    const WebPBitstreamFeatures* const features) {
  WebPIDecoder* idec = (WebPIDecoder*)WebPSafeCalloc(1ULL, sizeof(*idec));
  if (idec == NULL) {
    return NULL;
  }

  idec->state = STATE_WEBP_HEADER;
  idec->chunk_size = 0;

  idec->last_mb_y = -1;

  InitMemBuffer(&idec->mem);
  if (!WebPInitDecBuffer(&idec->output) || !VP8InitIo(&idec->io)) {
    WebPSafeFree(idec);
    return NULL;
  }

  WebPResetDecParams(&idec->params);
  if (output_buffer == NULL || WebPAvoidSlowMemory(output_buffer, features)) {
    idec->params.output = &idec->output;
    idec->final_output = output_buffer;
    if (output_buffer != NULL) {
      idec->params.output->colorspace = output_buffer->colorspace;
    }
  } else {
    idec->params.output = output_buffer;
    idec->final_output = NULL;
  }
  WebPInitCustomIo(&idec->params, &idec->io);  // Plug the I/O functions.

  return idec;
}